

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactTriangleXYZROT::LoadableGetStateBlock_x
          (ChContactTriangleXYZROT *this,int block_offset,ChState *mD)

{
  undefined1 *local_78 [2];
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_78[0] = &(((this->mnode1).
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChNodeFEAbase).field_0x20;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)block_offset,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  local_78[0] = &((this->mnode1).
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->field_0x38;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 3),4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  local_78[0] = &(((this->mnode2).
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChNodeFEAbase).field_0x20;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 7),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  local_78[0] = &((this->mnode2).
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->field_0x38;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 10),4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  local_78[0] = &(((this->mnode3).
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_ChNodeFEAbase).field_0x20;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0xe),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  local_78[0] = &((this->mnode3).
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->field_0x38;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0x11),4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_78);
  return;
}

Assistant:

void ChContactTriangleXYZROT::LoadableGetStateBlock_x(int block_offset, ChState& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos().eigen();
    mD.segment(block_offset + 3, 4) = mnode1->GetRot().eigen();

    mD.segment(block_offset + 7, 3) = mnode2->GetPos().eigen();
    mD.segment(block_offset + 10, 4) = mnode2->GetRot().eigen();

    mD.segment(block_offset + 14, 3) = mnode3->GetPos().eigen();
    mD.segment(block_offset + 17, 4) = mnode3->GetRot().eigen();
}